

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall DragonParser::InterNamespace::Node::error(Node *this,string *err)

{
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Near line " + this->lex_line,err);
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Node::error(string err) {
        throw std::logic_error("Near line " + lex_line + err);
    }